

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O0

string * __thiscall GraphPropagator::all_to_dot_abi_cxx11_(GraphPropagator *this,int *arr)

{
  bool bVar1;
  int iVar2;
  string *in_RDI;
  int e;
  int n;
  string *res;
  int in_stack_fffffffffffffd4c;
  undefined7 in_stack_fffffffffffffd50;
  undefined1 in_stack_fffffffffffffd57;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd58;
  undefined7 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd87;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd88;
  int in_stack_fffffffffffffd9c;
  int iVar3;
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [36];
  int local_f4;
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  int local_30;
  allocator local_1a;
  undefined1 local_19;
  
  local_19 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,"graph {\n",&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  for (local_30 = 0; iVar3 = local_30, iVar2 = nbNodes((GraphPropagator *)0x2aaf20), iVar3 < iVar2;
      local_30 = local_30 + 1) {
    getNodeVar((GraphPropagator *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
               in_stack_fffffffffffffd4c);
    bVar1 = BoolView::isFixed((BoolView *)0x2aaf6a);
    if (bVar1) {
      getNodeVar((GraphPropagator *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
                 in_stack_fffffffffffffd4c);
      bVar1 = BoolView::isTrue((BoolView *)
                               CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50));
      if (bVar1) {
        std::__cxx11::to_string(in_stack_fffffffffffffd9c);
        std::operator+((char *)in_stack_fffffffffffffd58,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50));
        std::operator+(in_stack_fffffffffffffd58,
                       (char *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50));
        std::__cxx11::string::operator+=((string *)in_RDI,local_50);
        std::__cxx11::string::~string(local_50);
        std::__cxx11::string::~string(local_70);
        std::__cxx11::string::~string(local_90);
      }
    }
    getNodeVar((GraphPropagator *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
               in_stack_fffffffffffffd4c);
    bVar1 = BoolView::isFixed((BoolView *)0x2ab126);
    if (bVar1) {
      getNodeVar((GraphPropagator *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
                 in_stack_fffffffffffffd4c);
      bVar1 = BoolView::isFalse((BoolView *)
                                CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50));
      if (bVar1) {
        std::__cxx11::to_string(in_stack_fffffffffffffd9c);
        std::operator+((char *)in_stack_fffffffffffffd58,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50));
        std::operator+(in_stack_fffffffffffffd58,
                       (char *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50));
        std::__cxx11::string::operator+=((string *)in_RDI,local_b0);
        std::__cxx11::string::~string(local_b0);
        std::__cxx11::string::~string(local_d0);
        std::__cxx11::string::~string(local_f0);
      }
    }
  }
  local_f4 = 0;
  do {
    iVar3 = local_f4;
    iVar2 = nbEdges((GraphPropagator *)0x2ab2aa);
    if (iVar2 <= iVar3) {
      std::__cxx11::string::operator+=((string *)in_RDI,"}");
      return in_RDI;
    }
    getTail((GraphPropagator *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
            in_stack_fffffffffffffd4c);
    std::__cxx11::to_string(iVar3);
    std::operator+((char *)in_stack_fffffffffffffd58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50));
    std::operator+(in_stack_fffffffffffffd58,
                   (char *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50));
    getHead((GraphPropagator *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
            in_stack_fffffffffffffd4c);
    std::__cxx11::to_string(iVar3);
    std::operator+(in_stack_fffffffffffffd88,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
    std::__cxx11::string::operator+=((string *)in_RDI,local_118);
    std::__cxx11::string::~string(local_118);
    std::__cxx11::string::~string(local_198);
    std::__cxx11::string::~string(local_138);
    std::__cxx11::string::~string(local_158);
    std::__cxx11::string::~string(local_178);
    in_stack_fffffffffffffd88 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         getEdgeVar((GraphPropagator *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50)
                    ,in_stack_fffffffffffffd4c);
    in_stack_fffffffffffffd87 = BoolView::isFixed((BoolView *)0x2ab3f2);
    if ((bool)in_stack_fffffffffffffd87) {
      getEdgeVar((GraphPropagator *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
                 in_stack_fffffffffffffd4c);
      bVar1 = BoolView::isTrue((BoolView *)
                               CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50));
      if (!bVar1) goto LAB_002ab50d;
      std::__cxx11::string::operator+=((string *)in_RDI," [color = red] ");
    }
    else {
LAB_002ab50d:
      getEdgeVar((GraphPropagator *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
                 in_stack_fffffffffffffd4c);
      bVar1 = BoolView::isFixed((BoolView *)0x2ab532);
      if (bVar1) {
        in_stack_fffffffffffffd58 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             getEdgeVar((GraphPropagator *)
                        CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
                        in_stack_fffffffffffffd4c);
        in_stack_fffffffffffffd57 =
             BoolView::isFalse((BoolView *)
                               CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50));
        if ((bool)in_stack_fffffffffffffd57) {
          std::__cxx11::string::operator+=((string *)in_RDI," [color = yellow] ");
        }
      }
    }
    std::__cxx11::to_string(iVar3);
    std::operator+((char *)in_stack_fffffffffffffd58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50));
    std::operator+(in_stack_fffffffffffffd58,
                   (char *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50));
    std::__cxx11::string::operator+=((string *)in_RDI,local_1b8);
    std::__cxx11::string::~string(local_1b8);
    std::__cxx11::string::~string(local_1d8);
    std::__cxx11::string::~string(local_1f8);
    std::__cxx11::string::operator+=((string *)in_RDI,";\n");
    local_f4 = local_f4 + 1;
  } while( true );
}

Assistant:

std::string GraphPropagator::all_to_dot(int* arr) {
	std::string res = "graph {\n";
	for (int n = 0; n < nbNodes(); n++) {
		if (getNodeVar(n).isFixed() && getNodeVar(n).isTrue()) {
			res += " " + std::to_string(n) + " [color = red];\n";
		}
		if (getNodeVar(n).isFixed() && getNodeVar(n).isFalse()) {
			res += " " + std::to_string(n) + " [color = yellow];\n";
		}
	}
	for (int e = 0; e < nbEdges(); e++) {
		res += " " + std::to_string(getTail(e)) + " -- " + std::to_string(getHead(e));
		if (getEdgeVar(e).isFixed() && getEdgeVar(e).isTrue()) {
			res += " [color = red] ";
		} else if (getEdgeVar(e).isFixed() && getEdgeVar(e).isFalse()) {
			res += " [color = yellow] ";
		}
		res += "[label = \"" + std::to_string(arr[e]) + "\"]";
		res += ";\n";
	}
	res += "}";

	return res;
}